

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTestTest.cpp
# Opt level: O3

void __thiscall SuiteTestTest::SuiteTestTest(SuiteTestTest *this)

{
  tuple<oout::SuiteTest_*,_std::default_delete<oout::SuiteTest>_> this_00;
  SuiteTest *pSVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 local_179;
  undefined1 local_178 [16];
  _Manager_type local_168;
  code *local_160;
  _Head_base<0UL,_oout::SuiteTest_*,_false> local_158;
  _Head_base<0UL,_oout::SuiteTest_*,_false> local_150;
  MatchTest *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_140;
  EqualTest *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_130 [2];
  shared_ptr<oout::FunctionText> local_120;
  __uniq_ptr_impl<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> local_110;
  shared_ptr<oout::EqualMatch> local_108;
  shared_ptr<TestText> local_f8;
  shared_ptr<oout::NamedTest> local_e8;
  shared_ptr<oout::EqualTest> local_d8;
  shared_ptr<oout::EqualTest> local_c8;
  shared_ptr<TestText> local_b8;
  shared_ptr<oout::EqualTest> local_a8;
  shared_ptr<oout::NamedTest> local_98;
  shared_ptr<TestText> local_88;
  shared_ptr<oout::EqualTest> local_78;
  shared_ptr<oout::NamedTest> local_68;
  string local_58;
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"SuiteTestTest","");
  local_38._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_38;
  local_38._M_impl._M_node._M_size = 0;
  local_38._M_impl._M_node.super__List_node_base._M_prev =
       local_38._M_impl._M_node.super__List_node_base._M_next;
  this_00.super__Tuple_impl<0UL,_oout::SuiteTest_*,_std::default_delete<oout::SuiteTest>_>.
  super__Head_base<0UL,_oout::SuiteTest_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_oout::SuiteTest_*,_std::default_delete<oout::SuiteTest>_>)
       operator_new(0x20);
  oout::SuiteTest::SuiteTest
            ((SuiteTest *)
             this_00.
             super__Tuple_impl<0UL,_oout::SuiteTest_*,_std::default_delete<oout::SuiteTest>_>.
             super__Head_base<0UL,_oout::SuiteTest_*,_false>._M_head_impl,
             (list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
              *)&local_38);
  local_88.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_110._M_t.super__Tuple_impl<0UL,_oout::SuiteTest_*,_std::default_delete<oout::SuiteTest>_>.
  super__Head_base<0UL,_oout::SuiteTest_*,_false>._M_head_impl =
       (tuple<oout::SuiteTest_*,_std::default_delete<oout::SuiteTest>_>)
       (tuple<oout::SuiteTest_*,_std::default_delete<oout::SuiteTest>_>)
       this_00.super__Tuple_impl<0UL,_oout::SuiteTest_*,_std::default_delete<oout::SuiteTest>_>.
       super__Head_base<0UL,_oout::SuiteTest_*,_false>._M_head_impl;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TestText,std::allocator<TestText>,std::unique_ptr<oout::SuiteTest,std::default_delete<oout::SuiteTest>>>
            (&local_88.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TestText **)&local_88,(allocator<TestText> *)local_178,
             (unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)&local_110);
  local_78.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::shared_ptr<TestText>,char_const(&)[8]>
            (&local_78.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_78,(allocator<oout::EqualTest> *)local_178,&local_88,
             (char (*) [8])0x17ca77);
  local_68.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest,std::allocator<oout::NamedTest>,char_const(&)[44],std::shared_ptr<oout::EqualTest>>
            (&local_68.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (NamedTest **)&local_68,(allocator<oout::NamedTest> *)local_178,
             (char (*) [44])"SuiteTest with empty list is always success",&local_78);
  local_138 = (EqualTest *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,char_const(&)[2],char_const(&)[2]>
            (a_Stack_130,&local_138,(allocator<oout::EqualTest> *)local_178,(char (*) [2])0x17d8ff,
             (char (*) [2])0x17d8ff);
  local_c8.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,char_const(&)[2],char_const(&)[2]>
            (&local_c8.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_c8,(allocator<oout::EqualTest> *)local_178,(char (*) [2])0x17d903,
             (char (*) [2])0x17d903);
  local_d8.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,char_const(&)[2],char_const(&)[2]>
            (&local_d8.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_d8,(allocator<oout::EqualTest> *)local_178,(char (*) [2])0x17d907,
             (char (*) [2])0x17d907);
  pSVar1 = (SuiteTest *)operator_new(0x20);
  local_178._0_8_ = local_138;
  local_178._8_8_ = a_Stack_130[0]._M_pi;
  local_138 = (EqualTest *)0x0;
  a_Stack_130[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  oout::SuiteTest::SuiteTest<oout::EqualTest,oout::EqualTest>
            (pSVar1,(shared_ptr<const_oout::Test> *)local_178,&local_c8,&local_d8);
  local_150._M_head_impl = pSVar1;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
  }
  local_b8.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TestText,std::allocator<TestText>,std::unique_ptr<oout::SuiteTest,std::default_delete<oout::SuiteTest>>>
            (&local_b8.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TestText **)&local_b8,(allocator<TestText> *)local_178,
             (unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)&local_150);
  local_a8.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::shared_ptr<TestText>,char_const(&)[8]>
            (&local_a8.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_a8,(allocator<oout::EqualTest> *)local_178,&local_b8,
             (char (*) [8])0x17ca77);
  local_98.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest,std::allocator<oout::NamedTest>,char_const(&)[38],std::shared_ptr<oout::EqualTest>>
            (&local_98.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (NamedTest **)&local_98,(allocator<oout::NamedTest> *)local_178,
             (char (*) [38])"SuiteTest give tests as variadic args",&local_a8);
  local_120.super___shared_ptr<oout::FunctionText,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001972f8;
  local_178._0_8_ = (element_type *)0x0;
  local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_160 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DronMDF[P]2out/test/SuiteTestTest.cpp:46:7)>
              ::_M_invoke;
  local_168 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DronMDF[P]2out/test/SuiteTestTest.cpp:46:7)>
              ::_M_manager;
  oout::FunctionText::FunctionText
            ((FunctionText *)(p_Var2 + 1),
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)local_178);
  if (local_168 != (_Manager_type)0x0) {
    (*local_168)((_Any_data *)local_178,(_Any_data *)local_178,__destroy_functor);
  }
  local_108.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_120.super___shared_ptr<oout::FunctionText,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (FunctionText *)(p_Var2 + 1);
  local_120.super___shared_ptr<oout::FunctionText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualMatch,std::allocator<oout::EqualMatch>,char_const(&)[5]>
            (&local_108.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(EqualMatch **)&local_108,(allocator<oout::EqualMatch> *)local_178,
             (char (*) [5])"Good");
  local_148 = (MatchTest *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::MatchTest,std::allocator<oout::MatchTest>,std::shared_ptr<oout::FunctionText>,std::shared_ptr<oout::EqualMatch>>
            (&_Stack_140,&local_148,(allocator<oout::MatchTest> *)local_178,&local_120,&local_108);
  pSVar1 = (SuiteTest *)operator_new(0x20);
  local_178._0_8_ = local_148;
  local_178._8_8_ = _Stack_140._M_pi;
  local_148 = (MatchTest *)0x0;
  _Stack_140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  oout::SuiteTest::SuiteTest<>(pSVar1,(shared_ptr<const_oout::Test> *)local_178);
  local_158._M_head_impl = pSVar1;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
  }
  local_f8.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TestText,std::allocator<TestText>,std::unique_ptr<oout::SuiteTest,std::default_delete<oout::SuiteTest>>>
            (&local_f8.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TestText **)&local_f8,(allocator<TestText> *)local_178,
             (unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)&local_158);
  local_178._0_8_ = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualMatch,std::allocator<oout::EqualMatch>,char_const(&)[6]>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_178 + 8),(EqualMatch **)local_178,
             (allocator<oout::EqualMatch> *)&local_179,(char (*) [6])0x17cdd7);
  local_e8.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest,std::allocator<oout::NamedTest>,char_const(&)[46],std::shared_ptr<TestText>,std::shared_ptr<oout::EqualMatch>>
            (&local_e8.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (NamedTest **)&local_e8,(allocator<oout::NamedTest> *)&local_179,
             (char (*) [46])"SuiteTest run each test in SafeTest decorator",&local_f8,
             (shared_ptr<oout::EqualMatch> *)local_178);
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>>
            (&this->super_Test,&local_58,&local_68,&local_98,&local_e8);
  if (local_e8.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
  }
  if (local_f8.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_>::~unique_ptr
            ((unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)&local_158);
  if (_Stack_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_140._M_pi);
  }
  if (local_108.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_120.super___shared_ptr<oout::FunctionText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.super___shared_ptr<oout::FunctionText,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_98.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_a8.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_b8.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_>::~unique_ptr
            ((unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)&local_150);
  if (local_d8.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c8.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (a_Stack_130[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_130[0]._M_pi);
  }
  if (local_68.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_88.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<TestText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_>::~unique_ptr
            ((unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)&local_110);
  std::__cxx11::
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  ::_M_clear(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_00197c28;
  return;
}

Assistant:

SuiteTestTest::SuiteTestTest()
: dirty::Test(
	"SuiteTestTest",
	make_shared<NamedTest>(
		"SuiteTest with empty list is always success",
		make_shared<EqualTest>(
			make_shared<TestText>(
				make_unique<SuiteTest>(
					list<shared_ptr<const oout::Test>>{}
				)
			),
			"success"
		)
	),
	make_shared<NamedTest>(
		"SuiteTest give tests as variadic args",
		make_shared<EqualTest>(
			make_shared<TestText>(
				make_unique<SuiteTest>(
					make_shared<EqualTest>("1", "1"),
					make_shared<EqualTest>("2", "2"),
					make_shared<EqualTest>("3", "3")
				)
			),
			"success"
		)
	),
	make_shared<NamedTest>(
		"SuiteTest run each test in SafeTest decorator",
		make_shared<TestText>(
			make_unique<SuiteTest>(
				make_shared<MatchTest>(
					make_shared<FunctionText>(
						[]() -> string {
							throw runtime_error("Shit");
						}
					),
					make_shared<EqualMatch>("Good")  // Not happen
				)
			)
		),
		make_shared<EqualMatch>("error")
	)
)
{
}